

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_B_ParamSet.c
# Opt level: O3

void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_to_montgomery(uint64_t *out1,uint64_t *arg1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *arg1;
  uVar14 = *arg1 * -0x3264;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar14;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = arg1[1];
  uVar10 = SUB168(ZEXT816(0x27acdc4) * auVar6,0);
  uVar17 = SUB168(auVar2 * ZEXT816(0xc99),8) + SUB168(auVar1 * ZEXT816(0x27acdc4),8) +
           (ulong)CARRY8(SUB168(auVar2 * ZEXT816(0xc99),0),SUB168(auVar1 * ZEXT816(0x27acdc4),0));
  uVar18 = uVar17 + uVar10;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar18 * -0x429985475ccb87a9;
  uVar15 = uVar14 >> 1 | uVar18 << 0x3f;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = arg1[2];
  uVar14 = SUB168(ZEXT816(0x27acdc4) * auVar7,0);
  uVar10 = SUB168(auVar3 * ZEXT816(0xc99),8) +
           SUB168(ZEXT816(0x27acdc4) * auVar6,8) + (ulong)CARRY8(uVar17,uVar10) +
           (ulong)CARRY8(SUB168(auVar3 * ZEXT816(0xc99),0),uVar18);
  uVar17 = uVar10 + uVar14;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar17 * -0x429985475ccb87a9;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SUB168(auVar4 * ZEXT816(0xc99),8) +
                 SUB168(ZEXT816(0x27acdc4) * auVar7,8) + (ulong)CARRY8(uVar10,uVar14) +
                 (ulong)CARRY8(SUB168(auVar4 * ZEXT816(0xc99),0),uVar17);
  uVar14 = uVar17 << 0x3f | uVar18 * -0x429985475ccb87a9 >> 1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = arg1[3];
  auVar9 = ZEXT816(0x27acdc4) * auVar8 + auVar9;
  uVar16 = auVar9._0_8_;
  uVar10 = auVar9._8_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar16 * -0x429985475ccb87a9;
  uVar18 = SUB168(auVar5 * ZEXT816(0xc99),8);
  uVar12 = uVar10 + uVar15;
  uVar10 = (ulong)CARRY8(uVar10,uVar15);
  uVar15 = uVar14 + uVar10;
  uVar11 = (uVar17 * -0x429985475ccb87a9 >> 1) + (ulong)CARRY8(uVar14,uVar10);
  uVar10 = (ulong)CARRY8(SUB168(auVar5 * ZEXT816(0xc99),0),uVar16);
  uVar14 = uVar12 + uVar18;
  uVar13 = uVar14 + uVar10;
  uVar10 = (ulong)(CARRY8(uVar12,uVar18) || CARRY8(uVar14,uVar10));
  uVar17 = uVar15 + uVar10;
  uVar10 = (ulong)CARRY8(uVar15,uVar10);
  uVar14 = uVar11 + (uVar16 << 0x3f);
  uVar15 = uVar14 + uVar10;
  uVar12 = (uVar16 * -0x429985475ccb87a9 >> 1) +
           (ulong)(CARRY8(uVar11,uVar16 << 0x3f) || CARRY8(uVar14,uVar10));
  uVar18 = (ulong)(byte)-((0xc98 < uVar13) + -1);
  uVar11 = (ulong)(uVar17 < uVar18);
  uVar16 = (ulong)(uVar15 < uVar11) | 0x8000000000000000;
  uVar10 = -(ulong)(uVar12 < uVar16);
  uVar14 = ~uVar10;
  *out1 = uVar13 - 0xc99 & uVar14 | uVar13 & uVar10;
  out1[1] = uVar17 - uVar18 & uVar14 | uVar17 & uVar10;
  out1[2] = uVar15 - uVar11 & uVar14 | uVar15 & uVar10;
  out1[3] = uVar14 & uVar12 - uVar16 | uVar10 & uVar12;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_to_montgomery(
    uint64_t out1[4], const uint64_t arg1[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x12;
    uint64_t x13;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x14;
    uint64_t x15;
    uint64_t x16;
    uint64_t x17;
    uint64_t x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x26;
    uint64_t x27;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x28;
    uint64_t x29;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x30;
    uint64_t x31;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x32;
    uint64_t x33;
    uint64_t x34;
    uint64_t x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x40;
    uint64_t x41;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x42;
    uint64_t x43;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x44;
    uint64_t x45;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x50;
    uint64_t x51;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x52;
    uint64_t x53;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x54;
    uint64_t x55;
    uint64_t x56;
    uint64_t x57;
    uint64_t x58;
    uint64_t x59;
    uint64_t x60;
    uint64_t x61;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x62;
    uint64_t x63;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x64;
    uint64_t x65;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x66;
    uint64_t x67;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x68;
    uint64_t x69;
    uint64_t x70;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x71;
    uint64_t x72;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x73;
    uint64_t x74;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x75;
    uint64_t x76;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x77;
    uint64_t x78;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x79;
    uint64_t x80;
    uint64_t x81;
    uint64_t x82;
    uint64_t x83;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x1, &x2, (arg1[0]),
                                                         UINT32_C(0x27acdc4));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x3, &x4, x1, UINT64_C(0xbd667ab8a3347857));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x5, &x6, x3, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x7, &x8, x3,
                                                         UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x9, &x10, (arg1[1]),
                                                         UINT32_C(0x27acdc4));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x11, &x12, 0x0,
                                                              x1, x7);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(
        &x13, &x14, 0x0, ((x12 + x2) + x8), x9);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x15, &x16, x13, UINT64_C(0xbd667ab8a3347857));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x17, &x18, x15, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x19, &x20, x15,
                                                         UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x21, &x22, 0x0,
                                                              x6, x17);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x23, &x24, (arg1[2]),
                                                         UINT32_C(0x27acdc4));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x25, &x26, 0x0,
                                                              x13, x19);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(
        &x27, &x28, 0x0, ((x26 + (x14 + x10)) + x20), x23);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x29, &x30, x28,
                                                              x5, x24);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x31, &x32, x30,
                                                              x21, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x33, &x34, x27, UINT64_C(0xbd667ab8a3347857));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x35, &x36, x33, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x37, &x38, x33,
                                                         UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x39, &x40, 0x0,
                                                              x27, x37);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x41, &x42, x40,
                                                              x29, x38);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x43, &x44, x42,
                                                              x31, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(
        &x45, &x46, x44, (x32 + (x22 + x18)), x35);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x47, &x48, (arg1[3]),
                                                         UINT32_C(0x27acdc4));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x49, &x50, 0x0,
                                                              x41, x47);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x51, &x52, x50,
                                                              x43, x48);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x53, &x54, x52,
                                                              x45, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x55, &x56, x49, UINT64_C(0xbd667ab8a3347857));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x57, &x58, x55, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x59, &x60, x55,
                                                         UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x61, &x62, 0x0,
                                                              x49, x59);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x63, &x64, x62,
                                                              x51, x60);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x65, &x66, x64,
                                                              x53, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(
        &x67, &x68, x66, (x54 + (x46 + x36)), x57);
    x69 = (x68 + x58);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(
        &x70, &x71, 0x0, x63, UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(&x72, &x73, x71,
                                                               x65, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(&x74, &x75, x73,
                                                               x67, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(
        &x76, &x77, x75, x69, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(&x78, &x79, x77,
                                                               0x0, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64(&x80, x79, x70,
                                                            x63);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64(&x81, x79, x72,
                                                            x65);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64(&x82, x79, x74,
                                                            x67);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64(&x83, x79, x76,
                                                            x69);
    out1[0] = x80;
    out1[1] = x81;
    out1[2] = x82;
    out1[3] = x83;
}